

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,string *hex_string)

{
  pointer *this_00;
  size_t sVar1;
  const_reference pvVar2;
  CfdException *pCVar3;
  allocator local_199;
  string local_198;
  size_t local_178;
  CfdSourceLocation local_170;
  ByteData local_158;
  ByteData local_140;
  allocator<unsigned_char> local_121;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  undefined1 local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_1;
  allocator<unsigned_char> local_b1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8 [8];
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  string local_60;
  CfdSourceLocation local_40;
  string *local_18;
  string *hex_string_local;
  ConfidentialAssetId *this_local;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_003ebf28;
  local_18 = hex_string;
  hex_string_local = (string *)this;
  ByteData::ByteData(&this->data_,hex_string);
  this->version_ = '\x01';
  sVar1 = ByteData::GetDataSize(&this->data_);
  if (sVar1 == 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x161;
    local_40.funcname = "ConfidentialAssetId";
    logger::warn<std::__cxx11::string_const&>
              (&local_40,"Empty ConfidentialAssetId. hex_string={}.",local_18);
    data._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_60,"Empty AssetId is invalid.",(allocator *)((long)&data + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_60);
    data._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (sVar1 == 0x20) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &reverse_buffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&this->data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(local_a8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend(local_b0);
    ::std::allocator<unsigned_char>::allocator(&local_b1);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a0,
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_a8,
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_b0,&local_b1);
    ::std::allocator<unsigned_char>::~allocator(&local_b1);
    ByteData::ByteData((ByteData *)&data_1,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    ByteData::operator=(&this->data_,(ByteData *)&data_1);
    ByteData::~ByteData((ByteData *)&data_1);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    if (sVar1 != 0x21) {
      local_170.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_170.filename = local_170.filename + 1;
      local_170.line = 0x17a;
      local_170.funcname = "ConfidentialAssetId";
      local_178 = ByteData::GetDataSize(&this->data_);
      logger::warn<unsigned_long>(&local_170,"AssetId size Invalid. size={}.",&local_178);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_198,"AssetId size Invalid.",&local_199);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_198);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&this->data_);
    this_00 = &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_118._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    local_110 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_118,1);
    local_120._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    ::std::allocator<unsigned_char>::allocator(&local_121);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,local_110,local_120,
               &local_121);
    ::std::allocator<unsigned_char>::~allocator(&local_121);
    pvVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
    this->version_ = *pvVar2;
    if (this->version_ == '\0') {
      ByteData::ByteData(&local_140);
      ByteData::operator=(&this->data_,&local_140);
      ByteData::~ByteData(&local_140);
    }
    else {
      ByteData::ByteData(&local_158,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
      ByteData::operator=(&this->data_,&local_158);
      ByteData::~ByteData(&local_158);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  CheckVersion(this->version_);
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const std::string &hex_string)
    : data_(hex_string), version_(kConfidentialVersion_1) {
  switch (data_.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. hex_string={}.",
          hex_string);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      // reverse
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
      data_ = ByteData(reverse_buffer);
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      } else {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          data_.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}